

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task28.cpp
# Opt level: O1

int main(void)

{
  time_t tVar1;
  istream *piVar2;
  int *arr_00;
  ulong uVar3;
  long lVar4;
  size_type __new_size;
  int *piVar5;
  initializer_list<int> __l;
  int n;
  vector<int,_std::allocator<int>_> arr2;
  int c;
  int b;
  int a;
  int arr [3];
  allocator_type local_6d;
  int local_6c;
  vector<int,_std::allocator<int>_> local_68;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  std::istream::operator>>((istream *)&std::cin,&local_6c);
  __new_size = (size_type)local_6c;
  if (__new_size == 3) {
    piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_3c);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&local_40);
    std::istream::operator>>(piVar2,&local_44);
    Bozo_sort(&local_3c,&local_40,&local_44,ABC);
    local_2c = local_3c;
    local_28 = local_40;
    local_24 = local_44;
    Bozo_sort(&local_2c,3,DESC);
    local_38 = local_3c;
    local_34 = local_40;
    local_30 = local_44;
    __l._M_len = 3;
    __l._M_array = &local_38;
    std::vector<int,_std::allocator<int>_>::vector(&local_68,__l,&local_6d);
    Bozo_sort(&local_68,DESC);
  }
  else {
    uVar3 = 0xffffffffffffffff;
    if (-1 < local_6c) {
      uVar3 = __new_size * 4;
    }
    arr_00 = (int *)operator_new__(uVar3);
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize(&local_68,__new_size);
    if (0 < local_6c) {
      lVar4 = 0;
      piVar5 = arr_00;
      do {
        std::istream::operator>>((istream *)&std::cin,piVar5);
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar4] = *piVar5;
        lVar4 = lVar4 + 1;
        piVar5 = piVar5 + 1;
      } while (lVar4 < local_6c);
    }
    Bozo_sort(arr_00,local_6c,ABC);
    operator_delete__(arr_00);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(){
    srand(time(NULL));
    int n;

    cin >> n;

    if (n == 3){
        int a,b,c;
        cin >> a >> b >> c;
        Bozo_sort(&a, &b, &c);
        int arr[] = {a,b,c};
        Bozo_sort(arr, 3, DESC);
        vector<int> arr2 ={a, b, c};
        Bozo_sort(arr2, DESC);
    } else {
        int *arr = new int[n];

        vector<int> arr2;
        arr2.resize(n);
        for (int i = 0; i < n; i++){
            cin >> arr[i];
            arr2[i] = arr[i];
        }

        Bozo_sort(arr, n);
//        Bozo_sort(arr2, DESC);


        delete[] arr;
    }
    return 0;
}